

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O1

CURLUcode curl_url_get(CURLU *u,CURLUPart what,char **part,uint flags)

{
  int iVar1;
  CURLcode CVar2;
  char *plus;
  char *pcVar3;
  undefined4 extraout_var;
  Curl_handler *pCVar4;
  char *pcVar5;
  char *pcVar6;
  CURLUcode CVar7;
  char *pcVar8;
  char *scheme;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  char *pcVar12;
  char *pcVar13;
  uint uVar14;
  char *pcVar15;
  char *pcVar16;
  char *pcVar17;
  uint uVar18;
  char *pcVar19;
  char *pcVar20;
  bool bVar21;
  bool bVar22;
  char portbuf [7];
  char *decoded;
  size_t dlen;
  
  if (u == (CURLU *)0x0) {
    return CURLUE_BAD_HANDLE;
  }
  if (part == (char **)0x0) {
    return CURLUE_BAD_PARTPOINTER;
  }
  uVar14 = flags >> 6 & 3;
  *part = (char *)0x0;
  CVar7 = CURLUE_UNKNOWN_PART;
  if (what < (CURLUPART_QUERY|CURLUPART_USER)) {
    pcVar3 = (char *)((long)&switchD_0051991a::switchdataD_0059c52c +
                     (long)(int)(&switchD_0051991a::switchdataD_0059c52c)[what]);
    switch(what) {
    case CURLUPART_URL:
      pcVar6 = u->options;
      pcVar15 = u->port;
      if (u->scheme == (char *)0x0) {
LAB_00519b39:
        if (u->host == (char *)0x0) {
          return CURLUE_NO_HOST;
        }
        scheme = u->scheme;
        if (scheme == (char *)0x0) {
          if ((flags & 4) != 0) {
            scheme = "https";
            goto LAB_00519b74;
          }
          bVar21 = false;
        }
        else {
LAB_00519b74:
          pCVar4 = Curl_builtin_scheme(scheme);
          if ((flags & 1) == 0 || pcVar15 != (char *)0x0) {
            if (pCVar4 != (Curl_handler *)0x0 && pcVar15 != (char *)0x0) {
              pcVar3 = (char *)0x0;
              if (pCVar4->defport != u->portnum) {
                pcVar3 = pcVar15;
              }
              if ((flags & 2) != 0) {
                pcVar15 = pcVar3;
              }
            }
          }
          else if (pCVar4 == (Curl_handler *)0x0) {
            pCVar4 = (Curl_handler *)0x0;
            pcVar15 = (char *)0x0;
          }
          else {
            curl_msnprintf(portbuf,7,"%ld",pCVar4->defport);
            pcVar15 = portbuf;
          }
          if ((pCVar4 != (Curl_handler *)0x0) && ((pCVar4->flags & 0x400) == 0)) {
            pcVar6 = (char *)0x0;
          }
          pcVar3 = u->user;
          pcVar9 = u->password;
          bVar21 = pcVar9 == (char *)0x0;
          pcVar11 = ":";
          pcVar5 = ":";
          if (bVar21) {
            pcVar5 = "";
            pcVar9 = "";
          }
          bVar22 = pcVar6 == (char *)0x0;
          pcVar10 = ";";
          if (bVar22) {
            pcVar10 = "";
            pcVar6 = "";
          }
          pcVar13 = "@";
          if (bVar22) {
            pcVar13 = "";
          }
          if (!bVar21) {
            pcVar13 = "@";
          }
          if (pcVar3 == (char *)0x0) {
            pcVar3 = "";
          }
          else {
            pcVar13 = "@";
          }
          if (pcVar15 == (char *)0x0) {
            pcVar11 = "";
            pcVar15 = "";
          }
          pcVar8 = u->path;
          if (pcVar8 == (char *)0x0) {
            pcVar8 = "/";
            pcVar17 = "";
          }
          else {
            pcVar17 = "/";
            if (*pcVar8 == '/') {
              pcVar17 = "";
            }
          }
          pcVar16 = u->query;
          pcVar19 = u->fragment;
          pcVar12 = "?";
          if (pcVar16 == (char *)0x0) {
            pcVar12 = "";
            pcVar16 = "";
          }
          pcVar20 = "#";
          if (pcVar19 == (char *)0x0) {
            pcVar20 = "";
            pcVar19 = "";
          }
          pcVar3 = curl_maprintf("%s://%s%s%s%s%s%s%s%s%s%s%s%s%s%s%s",scheme,pcVar3,pcVar5,pcVar9,
                                 pcVar10,pcVar6,pcVar13,u->host,pcVar11,pcVar15,pcVar17,pcVar8,
                                 pcVar12,pcVar16,pcVar20,pcVar19);
          bVar21 = true;
        }
        if (!bVar21) {
          return CURLUE_NO_SCHEME;
        }
      }
      else {
        iVar1 = Curl_strcasecompare("file",u->scheme);
        pcVar3 = (char *)CONCAT44(extraout_var,iVar1);
        if (iVar1 == 0) goto LAB_00519b39;
        pcVar3 = u->fragment;
        pcVar6 = "#";
        if (pcVar3 == (char *)0x0) {
          pcVar6 = "";
          pcVar3 = "";
        }
        pcVar3 = curl_maprintf("file://%s%s%s",u->path,pcVar6,pcVar3);
      }
      if (pcVar3 == (char *)0x0) goto LAB_00519d21;
      *part = pcVar3;
      goto LAB_00519d1d;
    case CURLUPART_SCHEME:
      pcVar3 = u->scheme;
      CVar7 = CURLUE_NO_SCHEME;
LAB_005199eb:
      uVar14 = 0;
      break;
    case CURLUPART_USER:
      CVar7 = CURLUE_NO_USER;
      pcVar3 = u->user;
      break;
    case CURLUPART_PASSWORD:
      CVar7 = CURLUE_NO_PASSWORD;
      pcVar3 = u->password;
      break;
    case CURLUPART_OPTIONS:
      CVar7 = CURLUE_NO_OPTIONS;
      pcVar3 = u->options;
      break;
    case CURLUPART_HOST:
      CVar7 = CURLUE_NO_HOST;
      pcVar3 = u->host;
      break;
    case CURLUPART_PORT:
      pcVar3 = u->port;
      if (((flags & 1) == 0 || pcVar3 != (char *)0x0) || (u->scheme == (char *)0x0)) {
        CVar7 = CURLUE_NO_PORT;
        if (pcVar3 == (char *)0x0) goto LAB_00519b55;
        if ((u->scheme == (char *)0x0) ||
           (pCVar4 = Curl_builtin_scheme(u->scheme), pCVar4 == (Curl_handler *)0x0))
        goto LAB_005199eb;
        uVar14 = 0;
        pcVar6 = (char *)0x0;
        if (pCVar4->defport != u->portnum) {
          pcVar6 = pcVar3;
        }
        if ((flags & 2) != 0) {
          pcVar3 = pcVar6;
        }
      }
      else {
        pCVar4 = Curl_builtin_scheme(u->scheme);
        CVar7 = CURLUE_NO_PORT;
        if (pCVar4 == (Curl_handler *)0x0) {
LAB_00519b55:
          CVar7 = CURLUE_NO_PORT;
          uVar14 = 0;
          goto LAB_00519b58;
        }
        uVar14 = 0;
        curl_msnprintf(portbuf,7,"%ld",pCVar4->defport);
        pcVar3 = portbuf;
      }
      break;
    case CURLUPART_PATH:
      pcVar3 = u->path;
      if (u->path == (char *)0x0) {
        pcVar3 = (*Curl_cstrdup)("/");
        u->path = pcVar3;
        if (pcVar3 != (char *)0x0) break;
        goto LAB_00519d21;
      }
      break;
    case CURLUPART_QUERY:
      pcVar3 = u->query;
      CVar7 = CURLUE_NO_QUERY;
      uVar18 = uVar14;
      goto LAB_005199fc;
    case CURLUPART_FRAGMENT:
      CVar7 = CURLUE_NO_FRAGMENT;
      pcVar3 = u->fragment;
    }
    uVar18 = 0;
  }
  else {
LAB_00519b58:
    pcVar3 = (char *)0x0;
    uVar18 = 0;
  }
LAB_005199fc:
  if (pcVar3 != (char *)0x0) {
    pcVar3 = (*Curl_cstrdup)(pcVar3);
    *part = pcVar3;
    if (pcVar3 == (char *)0x0) {
LAB_00519d21:
      CVar7 = CURLUE_OUT_OF_MEMORY;
    }
    else {
      if ((uVar18 & 1) != 0) {
        do {
          if (*pcVar3 == '+') {
            *pcVar3 = ' ';
          }
          else if (*pcVar3 == '\0') break;
          pcVar3 = pcVar3 + 1;
        } while( true );
      }
      if ((uVar14 & 1) != 0) {
        CVar2 = Curl_urldecode((Curl_easy *)0x0,*part,0,&decoded,&dlen,true);
        (*Curl_cfree)(*part);
        pcVar3 = (char *)0x0;
        if (CVar2 == CURLE_OK) {
          pcVar3 = decoded;
        }
        *part = pcVar3;
        if (CVar2 != CURLE_OK) {
          return CURLUE_URLDECODE;
        }
      }
LAB_00519d1d:
      CVar7 = CURLUE_OK;
    }
  }
  return CVar7;
}

Assistant:

CURLUcode curl_url_get(CURLU *u, CURLUPart what,
                       char **part, unsigned int flags)
{
  char *ptr;
  CURLUcode ifmissing = CURLUE_UNKNOWN_PART;
  char portbuf[7];
  bool urldecode = (flags & CURLU_URLDECODE)?1:0;
  bool plusdecode = FALSE;
  (void)flags;
  if(!u)
    return CURLUE_BAD_HANDLE;
  if(!part)
    return CURLUE_BAD_PARTPOINTER;
  *part = NULL;

  switch(what) {
  case CURLUPART_SCHEME:
    ptr = u->scheme;
    ifmissing = CURLUE_NO_SCHEME;
    urldecode = FALSE; /* never for schemes */
    break;
  case CURLUPART_USER:
    ptr = u->user;
    ifmissing = CURLUE_NO_USER;
    break;
  case CURLUPART_PASSWORD:
    ptr = u->password;
    ifmissing = CURLUE_NO_PASSWORD;
    break;
  case CURLUPART_OPTIONS:
    ptr = u->options;
    ifmissing = CURLUE_NO_OPTIONS;
    break;
  case CURLUPART_HOST:
    ptr = u->host;
    ifmissing = CURLUE_NO_HOST;
    break;
  case CURLUPART_PORT:
    ptr = u->port;
    ifmissing = CURLUE_NO_PORT;
    urldecode = FALSE; /* never for port */
    if(!ptr && (flags & CURLU_DEFAULT_PORT) && u->scheme) {
      /* there's no stored port number, but asked to deliver
         a default one for the scheme */
      const struct Curl_handler *h =
        Curl_builtin_scheme(u->scheme);
      if(h) {
        snprintf(portbuf, sizeof(portbuf), "%ld", h->defport);
        ptr = portbuf;
      }
    }
    else if(ptr && u->scheme) {
      /* there is a stored port number, but ask to inhibit if
         it matches the default one for the scheme */
      const struct Curl_handler *h =
        Curl_builtin_scheme(u->scheme);
      if(h && (h->defport == u->portnum) &&
         (flags & CURLU_NO_DEFAULT_PORT))
        ptr = NULL;
    }
    break;
  case CURLUPART_PATH:
    ptr = u->path;
    if(!ptr) {
      ptr = u->path = strdup("/");
      if(!u->path)
        return CURLUE_OUT_OF_MEMORY;
    }
    break;
  case CURLUPART_QUERY:
    ptr = u->query;
    ifmissing = CURLUE_NO_QUERY;
    plusdecode = urldecode;
    break;
  case CURLUPART_FRAGMENT:
    ptr = u->fragment;
    ifmissing = CURLUE_NO_FRAGMENT;
    break;
  case CURLUPART_URL: {
    char *url;
    char *scheme;
    char *options = u->options;
    char *port = u->port;
    if(u->scheme && strcasecompare("file", u->scheme)) {
      url = aprintf("file://%s%s%s",
                    u->path,
                    u->fragment? "#": "",
                    u->fragment? u->fragment : "");
    }
    else if(!u->host)
      return CURLUE_NO_HOST;
    else {
      const struct Curl_handler *h = NULL;
      if(u->scheme)
        scheme = u->scheme;
      else if(flags & CURLU_DEFAULT_SCHEME)
        scheme = (char *) DEFAULT_SCHEME;
      else
        return CURLUE_NO_SCHEME;

      if(scheme) {
        h = Curl_builtin_scheme(scheme);
        if(!port && (flags & CURLU_DEFAULT_PORT)) {
          /* there's no stored port number, but asked to deliver
             a default one for the scheme */
          if(h) {
            snprintf(portbuf, sizeof(portbuf), "%ld", h->defport);
            port = portbuf;
          }
        }
        else if(port) {
          /* there is a stored port number, but asked to inhibit if it matches
             the default one for the scheme */
          if(h && (h->defport == u->portnum) &&
             (flags & CURLU_NO_DEFAULT_PORT))
            port = NULL;
        }
      }
      if(h && !(h->flags & PROTOPT_URLOPTIONS))
        options = NULL;

      url = aprintf("%s://%s%s%s%s%s%s%s%s%s%s%s%s%s%s%s",
                    scheme,
                    u->user ? u->user : "",
                    u->password ? ":": "",
                    u->password ? u->password : "",
                    options ? ";" : "",
                    options ? options : "",
                    (u->user || u->password || options) ? "@": "",
                    u->host,
                    port ? ":": "",
                    port ? port : "",
                    (u->path && (u->path[0] != '/')) ? "/": "",
                    u->path ? u->path : "/",
                    u->query? "?": "",
                    u->query? u->query : "",
                    u->fragment? "#": "",
                    u->fragment? u->fragment : "");
    }
    if(!url)
      return CURLUE_OUT_OF_MEMORY;
    *part = url;
    return CURLUE_OK;
    break;
  }
  default:
    ptr = NULL;
  }
  if(ptr) {
    *part = strdup(ptr);
    if(!*part)
      return CURLUE_OUT_OF_MEMORY;
    if(plusdecode) {
      /* convert + to space */
      char *plus;
      for(plus = *part; *plus; ++plus) {
        if(*plus == '+')
          *plus = ' ';
      }
    }
    if(urldecode) {
      char *decoded;
      size_t dlen;
      CURLcode res = Curl_urldecode(NULL, *part, 0, &decoded, &dlen, TRUE);
      free(*part);
      if(res) {
        *part = NULL;
        return CURLUE_URLDECODE;
      }
      *part = decoded;
    }
    return CURLUE_OK;
  }
  else
    return ifmissing;
}